

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_test.c
# Opt level: O0

void test_url_query_param(void)

{
  nng_err num;
  int iVar1;
  uint32_t uVar2;
  char *pcVar3;
  char *pcVar4;
  nng_url *pnStack_10;
  nng_err result_;
  nng_url *url;
  
  num = nng_url_parse(&stack0xfffffffffffffff0,"http://www.google.com?color=red");
  pcVar3 = nng_strerror(num);
  iVar1 = acutest_check_((uint)(num == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                         ,0xbf,"%s: expected success, got %s (%d)",
                         "nng_url_parse(&url, \"http://www.google.com?color=red\")",pcVar3,num);
  if (iVar1 == 0) {
    acutest_abort_();
  }
  iVar1 = acutest_check_((uint)(pnStack_10 != (nng_url *)0x0),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                         ,0xc0,"%s","url != NULL");
  if (iVar1 == 0) {
    acutest_abort_();
  }
  pcVar3 = nng_url_scheme(pnStack_10);
  iVar1 = strcmp(pcVar3,"http");
  pcVar3 = nng_url_scheme(pnStack_10);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0xc1,"%s == %s",pcVar3,"http");
  pcVar3 = nng_url_hostname(pnStack_10);
  iVar1 = strcmp(pcVar3,"www.google.com");
  pcVar3 = nng_url_hostname(pnStack_10);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0xc2,"%s == %s",pcVar3,"www.google.com");
  pcVar3 = nng_url_path(pnStack_10);
  iVar1 = strcmp(pcVar3,"");
  pcVar3 = nng_url_path(pnStack_10);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0xc3,"%s == %s",pcVar3,"");
  uVar2 = nng_url_port(pnStack_10);
  acutest_check_((uint)(uVar2 == 0x50),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0xc4,"%s","nng_url_port(url) == 80");
  pcVar3 = nng_url_query(pnStack_10);
  iVar1 = strcmp(pcVar3,"color=red");
  pcVar3 = nng_url_query(pnStack_10);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0xc5,"%s == %s",pcVar3,"color=red");
  iVar1 = acutest_check_((uint)(pnStack_10 != (nng_url *)0x0),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                         ,0xc6,"%s","url != NULL");
  if (iVar1 == 0) {
    acutest_abort_();
  }
  pcVar3 = nng_url_userinfo(pnStack_10);
  pcVar4 = nng_url_userinfo(pnStack_10);
  acutest_check_((uint)(pcVar3 == (char *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,199,"%p == NULL",pcVar4);
  nng_url_free(pnStack_10);
  return;
}

Assistant:

void
test_url_query_param(void)
{
	nng_url *url;
	NUTS_PASS(nng_url_parse(&url, "http://www.google.com?color=red"));
	NUTS_ASSERT(url != NULL);
	NUTS_MATCH(nng_url_scheme(url), "http");
	NUTS_MATCH(nng_url_hostname(url), "www.google.com");
	NUTS_MATCH(nng_url_path(url), "");
	NUTS_TRUE(nng_url_port(url) == 80);
	NUTS_MATCH(nng_url_query(url), "color=red");
	NUTS_ASSERT(url != NULL);
	NUTS_NULL(nng_url_userinfo(url));
	nng_url_free(url);
}